

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

double __thiscall
ProbabEstimator::getProbabFast(ProbabEstimator *this,double *vecMaxs,int numReplaced,int pathLength)

{
  int in_EDX;
  int *in_RDI;
  double dVar1;
  int unaff_retaddr;
  int unaff_retaddr_00;
  double in_stack_00000008;
  ProbabEstimator *in_stack_00000010;
  undefined8 local_8;
  
  if (in_EDX == 0) {
    local_8 = getProbabGtFast2(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    local_8 = 1.0 - local_8;
  }
  else if (in_EDX == *in_RDI) {
    local_8 = getProbabLtFast2(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    local_8 = 1.0 - local_8;
  }
  else {
    dVar1 = getProbabLtFast2(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    local_8 = getProbabGtFast2(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    local_8 = (1.0 - dVar1) - local_8;
  }
  return local_8;
}

Assistant:

double ProbabEstimator::getProbabFast( const double *vecMaxs, const int numReplaced, const int pathLength ){
    if ( numReplaced == 0 ) return 1.0 - getProbabGtFast2( vecMaxs[numMaxs-1], 0, pathLength );
    if ( numReplaced == numMaxs ) return 1.0 - getProbabLtFast2( vecMaxs[0], numMaxs, pathLength );
    return 1.0 - getProbabLtFast2( vecMaxs[numMaxs-numReplaced], numReplaced, pathLength ) 
               - getProbabGtFast2( vecMaxs[numMaxs-numReplaced-1], numReplaced, pathLength );
}